

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panes.c
# Opt level: O0

void hex_driver(void *user_data,int input)

{
  uint64_t uVar1;
  int local_5c;
  uint64_t scroll;
  int error;
  uint8_t nd;
  uint8_t st;
  int iStack_44;
  uint8_t b;
  int n_1;
  int n;
  cursor_t bottom;
  cursor_t top;
  int width;
  int height;
  buffer_t *buffer;
  hex_pane_t *pane;
  void *pvStack_10;
  int input_local;
  void *user_data_local;
  
  _width = *user_data;
  if (_stdscr == 0) {
    local_5c = -1;
  }
  else {
    local_5c = *(short *)(_stdscr + 4) + 1;
  }
  top._4_4_ = local_5c;
  top._0_4_ = 0x10;
  bottom = *(long *)((long)user_data + 0x10) * 0x10;
  _n_1 = bottom + (long)((local_5c + -3) * 0x10);
  buffer = (buffer_t *)user_data;
  pane._4_4_ = input;
  pvStack_10 = user_data;
  if (input == 0x1b) {
    if (*(int *)((long)user_data + 0xc) != 0) {
      nodelay(_stdscr,1);
      iStack_44 = wgetch(_stdscr);
      if (iStack_44 == -1) {
        *(undefined4 *)((long)&buffer->data + 4) = 0;
      }
      else {
        ungetch(iStack_44);
      }
      nodelay(_stdscr,0);
    }
    goto LAB_00107297;
  }
  if (input == 0x2b) {
    buffer_bookmark_push(_width,_width->cursor);
    goto LAB_00107297;
  }
  if (input == 0x2d) {
    uVar1 = buffer_bookmark_pop(_width,0x10,local_5c,(int *)&scroll);
    if ((int)scroll == 0) {
      *(uint64_t *)&buffer->f = uVar1;
    }
    goto LAB_00107297;
  }
  if ((input - 0x30U < 10) || (input - 0x61U < 6)) {
    if (*(int *)((long)user_data + 0xc) == 0) goto LAB_00107297;
    if ((input < 0x30) || (0x39 < input)) {
      if ((0x60 < input) && (input < 0x67)) {
        error = input + -0x57;
      }
    }
    else {
      error = input + -0x30;
    }
    scroll._7_1_ = _width->data[_width->cursor];
    scroll._6_1_ = scroll._7_1_ & 0xf;
    scroll._5_1_ = (byte)error;
    if (*(int *)((long)user_data + 8) != 0) {
      scroll._5_1_ = (byte)((int)(scroll._7_1_ & 0xf0) >> 4);
      scroll._6_1_ = (byte)error;
    }
    _width->data[_width->cursor] = scroll._5_1_ << 4 | scroll._6_1_;
  }
  else {
    if (input == 0x68) {
LAB_00106c26:
      if (_width->cursor == 0) {
        if ((_width->cursor == 0) && (*(int *)((long)user_data + 8) != 0)) {
          *(undefined4 *)((long)user_data + 8) = 0;
        }
      }
      else {
        if ((*(int *)((long)user_data + 8) == 0) || (*(int *)((long)user_data + 0xc) == 0)) {
          _width->cursor = _width->cursor - 1;
        }
        *(uint *)((long)user_data + 8) = (uint)((*(int *)((long)user_data + 8) != 0 ^ 0xffU) & 1);
      }
      if ((_width->cursor - _width->cursor % 0x10 < bottom + 0x20) &&
         (*(long *)((long)user_data + 0x10) != 0)) {
        *(long *)((long)user_data + 0x10) = *(long *)((long)user_data + 0x10) + -1;
      }
      goto LAB_00107297;
    }
    if (input == 0x6a) {
LAB_00106cec:
      if (_width->cursor + 0x10 < _width->size) {
        _width->cursor = _width->cursor + 0x10;
      }
      else {
        _width->cursor = _width->size - 1;
      }
      if ((_n_1 - 0x20U < _width->cursor - _width->cursor % 0x10) &&
         ((*(long *)((long)user_data + 0x10) + (long)local_5c) - 3U < _width->size / 0x10)) {
        *(long *)((long)user_data + 0x10) = *(long *)((long)user_data + 0x10) + 1;
      }
      goto LAB_00107297;
    }
    if (input == 0x6b) {
LAB_00106ebb:
      if (_width->cursor < 0x10) {
        _width->cursor = 0;
      }
      else {
        _width->cursor = _width->cursor - 0x10;
      }
      if ((_width->cursor - _width->cursor % 0x10 < bottom + 0x20) &&
         (*(long *)((long)user_data + 0x10) != 0)) {
        *(long *)((long)user_data + 0x10) = *(long *)((long)user_data + 0x10) + -1;
      }
      goto LAB_00107297;
    }
    if (input != 0x6c) {
      if (input == 0x76) {
        if (*(int *)((long)user_data + 0xc) == 0) {
          if (_width->start_mark == 0xffffffffffffffff) {
            _width->start_mark = _width->cursor;
          }
          else if ((_width->end_mark == 0xffffffffffffffff) &&
                  (_width->start_mark != 0xffffffffffffffff)) {
            _width->end_mark = _width->cursor;
          }
          else if ((_width->end_mark != 0xffffffffffffffff) &&
                  (_width->start_mark != 0xffffffffffffffff)) {
            _width->start_mark = 0xffffffffffffffff;
            _width->end_mark = 0xffffffffffffffff;
          }
        }
        goto LAB_00107297;
      }
      if (input == 0x102) goto LAB_00106cec;
      if (input == 0x103) goto LAB_00106ebb;
      if (input == 0x104) goto LAB_00106c26;
      if (input != 0x105) {
        if (input == 0x106) {
          *(undefined8 *)((long)user_data + 0x10) = 0;
          _width->cursor = 0;
          *(undefined4 *)((long)user_data + 8) = 0;
        }
        else if (input == 0x10b) {
          if ((*(int *)((long)user_data + 0xc) == 0) && (_width->editable != 0)) {
            *(undefined4 *)((long)user_data + 0xc) = 1;
          }
        }
        else {
          if (input == 0x152) {
            if ((*(long *)((long)user_data + 0x10) + (long)local_5c) - 3U < _width->size / 0x10) {
              *(long *)((long)user_data + 0x10) =
                   (long)(local_5c + -3) + *(long *)((long)user_data + 0x10);
              _width->cursor = *(long *)((long)user_data + 0x10) * 0x10;
              goto LAB_00107297;
            }
          }
          else {
            if (input == 0x153) {
              if (*(ulong *)((long)user_data + 0x10) < (ulong)(long)(local_5c + -3)) {
                *(undefined8 *)((long)user_data + 0x10) = 0;
                _width->cursor = 0;
              }
              else {
                *(long *)((long)user_data + 0x10) =
                     *(long *)((long)user_data + 0x10) - (long)(local_5c + -3);
                _width->cursor = *(long *)((long)user_data + 0x10) * 0x10;
              }
              goto LAB_00107297;
            }
            if (input != 0x168) goto LAB_00107297;
          }
          *(ulong *)((long)user_data + 0x10) = (_width->size / 0x10 - (long)local_5c) + 3;
          _width->cursor = _width->size - 1;
          *(undefined4 *)((long)user_data + 8) = 1;
        }
        goto LAB_00107297;
      }
    }
  }
  if (_width->cursor < _width->size - 1) {
    if ((*(int *)((long)user_data + 8) == 1) || (*(int *)((long)user_data + 0xc) == 0)) {
      _width->cursor = _width->cursor + 1;
    }
    *(uint *)((long)user_data + 8) = (uint)((*(int *)((long)user_data + 8) != 0 ^ 0xffU) & 1);
  }
  else if ((_width->cursor == _width->size - 1) && (*(int *)((long)user_data + 8) == 0)) {
    *(undefined4 *)((long)user_data + 8) = 1;
  }
  if ((_n_1 - 0x20U < _width->cursor - _width->cursor % 0x10) &&
     ((*(long *)((long)user_data + 0x10) + (long)local_5c) - 3U < _width->size / 0x10)) {
    *(long *)((long)user_data + 0x10) = *(long *)((long)user_data + 0x10) + 1;
  }
LAB_00107297:
  hex_update((hex_pane_t *)buffer,(int)top,top._4_4_);
  return;
}

Assistant:

static void
hex_driver(void *user_data, int input)
{
    hex_pane_t *pane = (hex_pane_t*) user_data;
    buffer_t *buffer = pane->buffer;

    int height, width;
    getmaxyx(stdscr, height, width);
    width = 16;

    cursor_t top = pane->scroll * width;
    cursor_t bottom = top + (height - 3) * width;

    switch (input) {
    case 'h':
    case KEY_LEFT:
        if (buffer->cursor > 0) {
            if (pane->odd == 0 || !pane->edit) {
                buffer->cursor--;
            }
            pane->odd = !pane->odd;
        } else if (buffer->cursor == 0 && pane->odd) {
            // If the user is on the second nibble of the buffer and moves to
            // the left.
            //
            pane->odd = 0;
        }

        // If moving the cursor caused it to move off the screen, overflow scroll
        // upwards.
        //
        if (buffer->cursor - (buffer->cursor % width) < (top + width * 2)) {
            // If scrolling won't go off the screen.
            //
            if (pane->scroll > 0) {
                pane->scroll--;
            }
        }
        break;
    case 'j':
    case KEY_DOWN:
        if (buffer->cursor + width < buffer->size) {
            buffer->cursor += width;
        } else {
            // If on last row: snap cursor to end of the buffer.
            //
            buffer->cursor = buffer->size - 1;
        }

        // If overflow scrolled off the screen, seek downwards.
        //
        if (buffer->cursor - (buffer->cursor % width) > (bottom - width * 2)) {
            // If scrolling won't go off the screen.
            //
            if (pane->scroll + height - 3 < buffer->size / width) {
                pane->scroll++;
            }
        }
        break;
advance:
    case 'l':
    case KEY_RIGHT:
        if (buffer->cursor < buffer->size - 1) {
            if (pane->odd == 1 || !pane->edit) {
                buffer->cursor++;
            }
            pane->odd = !pane->odd;
        } else if (buffer->cursor == buffer->size - 1 && !pane->odd) {
            // If the user is on the 2nd last nibble of the buffer and moves to
            // the right.
            //
            pane->odd = 1;
        }

        // If moving the cursor caused it to move off the screen, overflow scroll
        // downwards.
        //
        if (buffer->cursor - (buffer->cursor % width) > (bottom - width * 2)) {
            // If scrolling won't go off the screen.
            //
            if (pane->scroll + height - 3 < buffer->size / width) {
                pane->scroll++;
            }
        }
        break;
    case 'k':
    case KEY_UP:
        if (buffer->cursor >= width) {
            buffer->cursor -= width;
        } else {
            // If on 1st row: snap cursor to the beginning of the buffer.
            //
            buffer->cursor = 0;
        }

        // If overflow scrolled off the screen, seek upwards.
        //
        if (buffer->cursor - (buffer->cursor % width) < (top + width * 2)) {
            // If scrolling won't go off the screen.
            //
            if (pane->scroll > 0) {
                pane->scroll--;
            }
        }
        break;
    case KEY_PPAGE:
        // If scrolling would send the cursor off the screen, reset to the
        // beginning.
        //
        if (pane->scroll < height - 3) {
            pane->scroll = 0;
            buffer->cursor = 0;
        } else {
            pane->scroll -= height - 3;
            buffer->cursor = pane->scroll * width;
        }
        break;
    case KEY_NPAGE:
        // If scrolling would send the cursor out of bounds, set the cursor
        // to the end of the buffer.
        //
        if (pane->scroll + height - 3 >= buffer->size / width) {
            goto end;
        } else {
            pane->scroll += height - 3;
            buffer->cursor = pane->scroll * width;
        }
        break;
end:
    case KEY_END:
        pane->scroll = buffer->size / width - height + 3;
        buffer->cursor = buffer->size - 1;
        pane->odd = 1;
        break;
    case KEY_HOME:
        pane->scroll = 0;
        buffer->cursor = 0;
        pane->odd = 0;
        break;
    case 'v':
        // No selection supported inside of edit mode.
        //
        if (pane->edit)
            break;

        if (buffer->start_mark == -1) {
            buffer->start_mark = buffer->cursor;
        } else if (buffer->end_mark == -1 && buffer->start_mark != -1) {
            buffer->end_mark = buffer->cursor;
        } else if (buffer->end_mark != -1 && buffer->start_mark != -1) {
            buffer->start_mark = -1;
            buffer->end_mark = -1;
        }
        break;
    case KEY_F(3):
        if (!pane->edit && buffer->editable) {
            pane->edit = 1;
        }
        break;
    case '\x1b': {
        // If in edit mode and ESC is hit, disable edit mode.
        //
        if (!pane->edit)
            break;

        nodelay(stdscr, TRUE);
        int n;
        if ((n = getch()) == ERR) {
            pane->edit = 0;
        } else {
            ungetch(n);
        }
        nodelay(stdscr, FALSE);
    } break;
    case 'a'...'f':
    case '0'...'9': {
        if (!pane->edit)
            break;

        // Convert character to integral representation.
        //
        int n;
        if (input >= '0' && input <= '9') {
            n = input - '0';
        } else if (input >= 'a' && input <= 'f') {
            n = 10 + input - 'a';
        }

        uint8_t b = buffer->data[buffer->cursor];
        uint8_t st = b & 0x0f;
        uint8_t nd = (b & 0xf0) >> 4;

        if (pane->odd) {
            st = n;
        } else {
            nd = n;
        }

        buffer->data[buffer->cursor] = ((nd << 4) | st);
        goto advance;
    } break;
    case '+':
        buffer_bookmark_push(buffer, buffer->cursor);
        break;
    case '-': {
        int error;
        uint64_t scroll = buffer_bookmark_pop(buffer, width, height, &error);
        if (!error) {
            pane->scroll = scroll;
        }
    } break;
    }

    hex_update(pane, width, height);
}